

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

time_t __thiscall Server::Private::time(Private *this,time_t *__timer)

{
  usize *puVar1;
  Item *pIVar2;
  Item *pIVar3;
  int64 iVar4;
  TimerImpl *pTVar5;
  ICallback *in_RDX;
  Item *pIVar6;
  TimerImpl *local_38;
  
  iVar4 = Time::ticks();
  pTVar5 = PoolList<Server::Private::TimerImpl>::allocateFreeItem(&this->_timers);
  pTVar5->callback = in_RDX;
  pTVar5->executionTime = iVar4 + (long)__timer;
  pTVar5->interval = (int64)__timer;
  pIVar2 = (this->_timers)._end.item;
  pIVar3 = (this->_timers).freeItem;
  (this->_timers).freeItem = pIVar3->prev;
  pIVar6 = pIVar2->prev;
  pIVar3->prev = pIVar6;
  if (pIVar6 == (Item *)0x0) {
    pIVar6 = (Item *)&this->_timers;
  }
  ((Iterator *)&pIVar6->next)->item = pIVar3;
  pIVar3->next = pIVar2;
  pIVar2->prev = pIVar3;
  puVar1 = &(this->_timers)._size;
  *puVar1 = *puVar1 + 1;
  local_38 = pTVar5;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert
            (&this->_queuedTimers,&(this->_queuedTimers).root,(Item *)0x0,&pTVar5->executionTime,
             &local_38);
  return (time_t)pTVar5;
}

Assistant:

Server::Timer *Server::Private::time(int64 interval, Timer::ICallback &callback)
{
  TimerImpl &timer = _timers.append<Timer::ICallback&, int64, int64>(callback, Time::ticks() + interval, interval);
  _queuedTimers.insert(timer.executionTime, &timer);
  return (Server::Timer *)&timer;
}